

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitArrayNew(PrintExpressionContents *this,ArrayNew *curr)

{
  ostream *poVar1;
  bool bVar2;
  HeapType type;
  string_view local_38;
  string_view local_28;
  ArrayNew *local_18;
  ArrayNew *curr_local;
  PrintExpressionContents *this_local;
  
  poVar1 = this->o;
  local_18 = curr;
  curr_local = (ArrayNew *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"array.new");
  printMedium(poVar1,local_28);
  bVar2 = ArrayNew::isWithDefault(local_18);
  if (bVar2) {
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"_default");
    printMedium(poVar1,local_38);
  }
  std::operator<<(this->o,' ');
  type = wasm::Type::getHeapType
                   (&(local_18->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression
                     .type);
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitArrayNew(ArrayNew* curr) {
    printMedium(o, "array.new");
    if (curr->isWithDefault()) {
      printMedium(o, "_default");
    }
    o << ' ';
    printHeapTypeName(curr->type.getHeapType());
  }